

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  type a;
  ostream *poVar1;
  pointer e;
  string local_530 [32];
  undefined1 local_510 [8];
  DefaultEvaluator eval;
  stringstream output;
  ostream local_4f0 [376];
  undefined1 local_378 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> ast;
  string local_368;
  undefined1 local_348 [8];
  Parser parser;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  allocator local_2b1;
  string local_2b0;
  undefined1 local_290 [8];
  Lexer lexer;
  ifstream source;
  
  std::ifstream::ifstream
            (&lexer.verbose,"C:\\Users\\Freddy\\Documents\\GitHub\\ninx\\examples\\example12.txt",
             _S_bin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"tests",&local_2b1);
  ninx::lexer::Lexer::Lexer((Lexer *)local_290,(istream *)&lexer.verbose,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  ninx::lexer::Lexer::set_verbose((Lexer *)local_290,true);
  ninx::lexer::Lexer::generate
            ((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
              *)&parser.operators._M_h._M_single_bucket,(Lexer *)local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_368,"tests",
             (allocator *)
             ((long)&ast._M_t.
                     super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                     .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl + 7)
            );
  ninx::parser::Parser::Parser
            ((Parser *)local_348,
             (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
              *)&parser.operators._M_h._M_single_bucket,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ast._M_t.
                     super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                     .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl + 7)
            );
  ninx::parser::Parser::parse((Parser *)local_378);
  a = std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      operator*((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_378);
  poVar1 = ninx::parser::element::operator<<((ostream *)&std::cout,(ASTElement *)a);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"############ OUTPUT #############");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream((stringstream *)&eval.output);
  ninx::evaluator::DefaultEvaluator::DefaultEvaluator((DefaultEvaluator *)local_510,local_4f0);
  e = std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      get((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           *)local_378);
  ninx::evaluator::DefaultEvaluator::evaluate((DefaultEvaluator *)local_510,e);
  std::__cxx11::stringstream::str();
  poVar1 = std::operator<<((ostream *)&std::cout,local_530);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_530);
  ninx::evaluator::DefaultEvaluator::~DefaultEvaluator((DefaultEvaluator *)local_510);
  std::__cxx11::stringstream::~stringstream((stringstream *)&eval.output);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_378);
  ninx::parser::Parser::~Parser((Parser *)local_348);
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             *)&parser.operators._M_h._M_single_bucket);
  ninx::lexer::Lexer::~Lexer((Lexer *)local_290);
  std::ifstream::~ifstream(&lexer.verbose);
  return 0;
}

Assistant:

int main() {
    //std::ifstream source{R"(/Users/freddy/Documents/GitHub/ninx/examples/example11.txt)", std::ios_base::binary};
    std::ifstream source{R"(C:\Users\Freddy\Documents\GitHub\ninx\examples\example12.txt)", std::ios_base::binary};

    Lexer lexer {source, "tests"};
    lexer.set_verbose(true);

    auto tokens = lexer.generate();

    Parser parser{tokens, "tests"};

    auto ast = parser.parse();

    std::cout << *ast << std::endl;

    std::cout << "############ OUTPUT #############" << std::endl;

    std::stringstream output;
    DefaultEvaluator eval {output};
    eval.evaluate(ast.get());

    std::cout << output.str() << std::endl;

    return 0;
}